

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process.cpp
# Opt level: O1

PAL_ERROR CorUnix::InternalCreateProcess
                    (CPalThread *pThread,LPCWSTR lpApplicationName,LPWSTR lpCommandLine,
                    LPSECURITY_ATTRIBUTES lpProcessAttributes,
                    LPSECURITY_ATTRIBUTES lpThreadAttributes,BOOL bInheritHandles,
                    DWORD dwCreationFlags,LPVOID lpEnvironment,LPCWSTR lpCurrentDirectory,
                    LPSTARTUPINFOW lpStartupInfo,LPPROCESS_INFORMATION lpProcessInformation)

{
  IDataLock *pIVar1;
  IPalObject *pIVar2;
  int iVar3;
  PAL_ERROR PVar4;
  BOOL BVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  int *piVar10;
  char **__argv;
  char **__envp;
  ulong uVar11;
  ssize_t sVar12;
  int iVar13;
  char *lpPathFileName;
  ulong uVar14;
  char *pcVar15;
  size_t szSize;
  undefined4 in_register_0000008c;
  undefined8 uVar16;
  long in_FS_OFFSET;
  int local_190;
  int local_18c;
  int pipe_descs [2];
  undefined8 uStack_110;
  CObjectAttributes oa;
  int *piStack_f0;
  UINT nArg;
  CProcProcessLocalData *pLocalData;
  CPalThread *pDummyThread;
  IPalObject *pobjProcessRegistered;
  HANDLE hDummyThread;
  HANDLE hProcess;
  IPalObject *pobjProcess;
  IDataLock *pLocalDataLock;
  IPalObject *pobjFileIn;
  IPalObject *pobjFileOut;
  IPalObject *pobjFileErr;
  int local_94;
  int local_90;
  int iFdIn;
  int iFdOut;
  int iFdErr;
  int local_80;
  BYTE local_79;
  undefined1 local_78 [7];
  BYTE resume_code;
  PathCharString lpFileNamePS;
  
  uVar16 = CONCAT44(in_register_0000008c,bInheritHandles);
  lpFileNamePS.m_count = *(SIZE_T *)(in_FS_OFFSET + 0x28);
  hProcess = (HANDLE)0x0;
  pDummyThread = (CPalThread *)0x0;
  pobjProcess = (IPalObject *)0x0;
  pLocalData = (CProcProcessLocalData *)0x0;
  pobjProcessRegistered = (IPalObject *)0x0;
  hDummyThread = (HANDLE)0x0;
  uStack_110 = 0;
  oa.sObjectName.m_pwsz = (WCHAR *)0x0;
  pLocalDataLock = (IDataLock *)0x0;
  local_94 = -1;
  pobjFileIn = (IPalObject *)0x0;
  local_90 = -1;
  pobjFileOut = (IPalObject *)0x0;
  iFdIn = -1;
  lpFileNamePS._32_8_ = local_78;
  lpFileNamePS.m_size = 0;
  oa.sObjectName._8_8_ = lpProcessAttributes;
  if (lpApplicationName != (LPCWSTR)0x0) {
    fprintf(_stderr,"] %s %s:%d","InternalCreateProcess",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/thread/process.cpp"
            ,0x21f,uVar16);
    pcVar15 = "lpApplicationName should be NULL, but is %S instead\n";
    goto LAB_001409ef;
  }
  if ((dwCreationFlags & 0xffffffeb) != 0) {
    fprintf(_stderr,"] %s %s:%d","InternalCreateProcess",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/thread/process.cpp"
            ,0x226,uVar16);
    pcVar15 = "Unexpected creation flags (%#x)\n";
    goto LAB_00140a4c;
  }
  if ((lpProcessAttributes == (LPSECURITY_ATTRIBUTES)0x0) ||
     ((lpProcessAttributes->lpSecurityDescriptor == (LPVOID)0x0 &&
      (lpProcessAttributes->bInheritHandle == 1)))) {
    if (lpThreadAttributes != (LPSECURITY_ATTRIBUTES)0x0) {
      fprintf(_stderr,"] %s %s:%d","InternalCreateProcess",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/thread/process.cpp"
              ,0x239,uVar16);
      pcVar15 = "lpThreadAttributes parameter must be NULL (%p)\n";
      lpApplicationName = (LPCWSTR)lpThreadAttributes;
      goto LAB_001409ef;
    }
    if (lpStartupInfo == (LPSTARTUPINFOW)0x0) {
      if (!PAL_InitializeChakraCoreCalled) goto LAB_00140fb9;
      PVar4 = 0x57;
      goto LAB_00140a69;
    }
    if (lpStartupInfo->cb < 0x68) {
      fprintf(_stderr,"] %s %s:%d","InternalCreateProcess",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/thread/process.cpp"
              ,0x24a,uVar16);
      dwCreationFlags = lpStartupInfo->cb;
      pcVar15 = "lpStartupInfo parameter structure size is invalid (%u)\n";
LAB_00140a4c:
      fprintf(_stderr,pcVar15,(ulong)dwCreationFlags);
      goto LAB_00140a63;
    }
    if ((lpStartupInfo->dwFlags & 0xfffffeff) != 0) {
      fprintf(_stderr,"] %s %s:%d","InternalCreateProcess",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/thread/process.cpp"
              ,0x253,uVar16);
      dwCreationFlags = lpStartupInfo->dwFlags;
      pcVar15 = "lpStartupInfo parameter invalid flags (%#x)\n";
      goto LAB_00140a4c;
    }
    if ((lpStartupInfo->dwFlags != 0) &&
       (((PVar4 = PrepareStandardHandle
                            (pThread,lpStartupInfo->hStdInput,(IPalObject **)&pLocalDataLock,
                             &local_94), PVar4 != 0 ||
         (PVar4 = PrepareStandardHandle(pThread,lpStartupInfo->hStdOutput,&pobjFileIn,&local_90),
         PVar4 != 0)) ||
        (PVar4 = PrepareStandardHandle(pThread,lpStartupInfo->hStdError,&pobjFileOut,&iFdIn),
        PVar4 != 0)))) goto LAB_00140a69;
    StackString<32UL,_char>::Resize((StackString<32UL,_char> *)local_78,0x3ff);
    if (lpFileNamePS._32_8_ == 0) {
      PVar4 = 8;
      goto LAB_00140a69;
    }
    pobjFileErr = (IPalObject *)lpFileNamePS._32_8_;
    BVar5 = getFileName(lpCommandLine,(LPWSTR)lpFileNamePS._32_8_,lpPathFileName);
    if (BVar5 == 0) {
LAB_00140ead:
      if (PAL_InitializeChakraCoreCalled == false) goto LAB_00140fb9;
      PVar4 = 2;
      goto LAB_00140a69;
    }
    if (0x3ff < lpFileNamePS.m_size) {
      lpFileNamePS.m_size = 0x3ff;
    }
    *(undefined1 *)(lpFileNamePS._32_8_ + lpFileNamePS.m_size) = 0;
    iVar3 = checkFileType((LPCSTR)pobjFileErr);
    if (iVar3 == 2) {
      if (PAL_InitializeChakraCoreCalled == false) goto LAB_00140fb9;
      PVar4 = 5;
      goto LAB_00140a69;
    }
    if (iVar3 != 1) goto LAB_00140ead;
    __argv = buildArgv(lpCommandLine,(LPSTR)pobjFileErr,(UINT *)((long)&oa.pSecurityAttributes + 4))
    ;
    if (lpEnvironment == (LPVOID)0x0) {
      __envp = (char **)0x0;
    }
    else {
      if (*lpEnvironment == '\0') {
        szSize = 8;
      }
      else {
        uVar6 = 0;
        iVar3 = 0;
        do {
          do {
            iVar13 = iVar3;
            uVar11 = (ulong)uVar6;
            uVar6 = uVar6 + 1;
            iVar3 = iVar13;
          } while (*(char *)((long)lpEnvironment + uVar11) != '\0');
          iVar3 = iVar13 + 1;
        } while (*(char *)((long)lpEnvironment + (ulong)uVar6) != '\0');
        szSize = (ulong)(iVar13 + 2) << 3;
      }
      __envp = (char **)InternalMalloc(szSize);
      uVar11 = 0;
      if (*lpEnvironment != '\0') {
        uVar6 = 0;
        pcVar15 = (char *)lpEnvironment;
        do {
          __envp[uVar11] = pcVar15;
          do {
            uVar14 = (ulong)uVar6;
            uVar6 = uVar6 + 1;
          } while (*(char *)((long)lpEnvironment + uVar14) != '\0');
          uVar7 = (int)uVar11 + 1;
          uVar11 = (ulong)uVar7;
          pcVar15 = (char *)((long)lpEnvironment + (ulong)uVar6);
        } while (*(char *)((long)lpEnvironment + (ulong)uVar6) != '\0');
        uVar11 = (ulong)uVar7;
      }
      __envp[uVar11] = (char *)0x0;
    }
    PVar4 = (**(code **)*g_pObjectManager)
                      (g_pObjectManager,pThread,&otProcess,&uStack_110,&hProcess);
    if (PVar4 == 0) {
      PVar4 = (**(code **)(*g_pObjectManager + 8))
                        (g_pObjectManager,pThread,hProcess,&aotProcess,0x1f0fff,&hDummyThread,
                         &pDummyThread);
      hProcess = (HANDLE)0x0;
      if (PVar4 != 0) goto LAB_00140fa9;
      PVar4 = InternalCreateDummyThread
                        (pThread,(LPSECURITY_ATTRIBUTES)0x0,(CPalThread **)&pLocalData,
                         &pobjProcessRegistered);
      local_80 = -1;
      iFdOut = -1;
      if ((dwCreationFlags & 4) == 0) {
LAB_00141058:
        PVar4 = (*pDummyThread->_vptr_CPalThread[3])
                          (pDummyThread,pThread,1,&pobjProcess,&stack0xffffffffffffff10);
        if (PVar4 == 0) {
          iFdErr = fork();
          if (iFdErr != -1) {
            if (iFdErr != 0) {
              close(local_80);
              *piStack_f0 = iFdErr;
              (**pobjProcess->_vptr_IPalObject)(pobjProcess,pThread,1);
              pobjProcess = (IPalObject *)0x0;
              if ((lpStartupInfo->dwFlags & 0x100) != 0) {
                (*pLocalDataLock->_vptr_IDataLock[8])(pLocalDataLock,pThread);
                pLocalDataLock = (IDataLock *)0x0;
                (*pobjFileIn->_vptr_IPalObject[8])(pobjFileIn,pThread);
                pobjFileIn = (IPalObject *)0x0;
                (*pobjFileOut->_vptr_IPalObject[8])(pobjFileOut,pThread);
                pobjFileOut = (IPalObject *)0x0;
              }
              lpProcessInformation->hProcess = hDummyThread;
              lpProcessInformation->hThread = pobjProcessRegistered;
              lpProcessInformation->dwProcessId = iFdErr;
              lpProcessInformation->dwThreadId_PAL_Undefined = 0;
              goto LAB_00140fa9;
            }
            init_count.m_val = 0;
            sigemptyset((sigset_t *)&stack0xfffffffffffffe70);
            iVar3 = sigprocmask(2,(sigset_t *)&stack0xfffffffffffffe70,(sigset_t *)0x0);
            if (iVar3 == 0) {
              if ((dwCreationFlags & 4) != 0) {
                local_79 = '\0';
                close(iFdOut);
                do {
                  sVar12 = read(local_80,&local_79,1);
                  if (sVar12 != -1) {
                    if ((sVar12 == 1) && (local_79 == '*')) {
                      close(local_80);
                      goto LAB_00141237;
                    }
                    break;
                  }
                  piVar10 = __errno_location();
                } while (*piVar10 == 4);
                if (*(SIZE_T *)(in_FS_OFFSET + 0x28) == lpFileNamePS.m_count) {
                  _exit(1);
                }
                goto LAB_001413a0;
              }
LAB_00141237:
              if (lpCurrentDirectory != (LPCWSTR)0x0) {
                SetCurrentDirectoryW(lpCurrentDirectory);
              }
              iVar3 = local_94;
              if ((lpStartupInfo->dwFlags & 0x100) != 0) {
                iVar8 = dup2(local_94,0);
                iVar13 = local_90;
                if (((iVar8 == -1) || (iVar9 = dup2(local_90,1), iVar8 = iFdIn, iVar9 == -1)) ||
                   (iVar9 = dup2(iFdIn,2), iVar9 == -1)) goto LAB_0014135c;
                close(iVar3);
                close(iVar13);
                close(iVar8);
              }
              if (__envp == (char **)0x0) {
                __envp = palEnvironment;
              }
              execve((char *)pobjFileErr,__argv,__envp);
            }
LAB_0014135c:
            if (*(SIZE_T *)(in_FS_OFFSET + 0x28) == lpFileNamePS.m_count) {
              _exit(1);
            }
            goto LAB_001413a0;
          }
          fprintf(_stderr,"] %s %s:%d","InternalCreateProcess",
                  "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/thread/process.cpp"
                  ,0x325);
          fprintf(_stderr,"Unable to create a new process with fork()\n");
          PVar4 = 0x54f;
          if (local_80 != -1) {
            close(local_80);
            close(iFdOut);
          }
        }
        else {
          fprintf(_stderr,"] %s %s:%d","InternalCreateProcess",
                  "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/thread/process.cpp"
                  ,0x31b);
          fprintf(_stderr,"Unable to obtain local data for new process object\n");
        }
      }
      else {
        iFdErr = pipe(&stack0xfffffffffffffe70);
        if (iFdErr == -1) {
          if (PAL_InitializeChakraCoreCalled == false) goto LAB_00140fb9;
          piVar10 = __errno_location();
          strerror(*piVar10);
          local_80 = -1;
          PVar4 = 8;
          iFdOut = -1;
        }
        else {
          iFdOut = local_18c;
          *(int *)(pLocalData + 0x49c) = local_18c;
          local_80 = local_190;
        }
        if (iFdErr != -1) goto LAB_00141058;
      }
    }
    else {
LAB_00140fa9:
      if (PAL_InitializeChakraCoreCalled == false) goto LAB_00140fb9;
    }
  }
  else {
    fprintf(_stderr,"] %s %s:%d","InternalCreateProcess",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/thread/process.cpp"
            ,0x231,uVar16);
    pcVar15 = "lpProcessAttributes is invalid, parameter ignored (%p)\n";
    lpApplicationName = (LPCWSTR)lpProcessAttributes;
LAB_001409ef:
    fprintf(_stderr,pcVar15,lpApplicationName);
LAB_00140a63:
    PVar4 = 0x57;
LAB_00140a69:
    __argv = (char **)0x0;
    __envp = (char **)0x0;
  }
  if (pobjProcess != (IPalObject *)0x0) {
    (**pobjProcess->_vptr_IPalObject)(pobjProcess,pThread,0);
  }
  if (hProcess != (HANDLE)0x0) {
    (**(code **)(*hProcess + 0x40))(hProcess,pThread);
  }
  if (pDummyThread != (CPalThread *)0x0) {
    (*pDummyThread->_vptr_CPalThread[8])(pDummyThread,pThread);
  }
  if (PVar4 != 0) {
    if (hDummyThread != (HANDLE)0x0) {
      (**(code **)(*g_pObjectManager + 0x20))(g_pObjectManager,pThread);
    }
    if (pobjProcessRegistered != (IPalObject *)0x0) {
      (**(code **)(*g_pObjectManager + 0x20))(g_pObjectManager,pThread);
    }
  }
  if (__envp != (char **)0x0) {
    free(__envp);
  }
  pIVar1 = pLocalDataLock;
  if (pLocalDataLock != (IDataLock *)0x0) {
    iVar3 = fcntl64(local_94,2,1);
    if (iVar3 == -1) {
      if (PAL_InitializeChakraCoreCalled == false) goto LAB_00140fb9;
      piVar10 = __errno_location();
      strerror(*piVar10);
    }
    (*pIVar1->_vptr_IDataLock[8])(pIVar1,pThread);
  }
  pIVar2 = pobjFileIn;
  if (pobjFileIn != (IPalObject *)0x0) {
    iVar3 = fcntl64(local_90,2,1);
    if (iVar3 == -1) {
      if (PAL_InitializeChakraCoreCalled == false) goto LAB_00140fb9;
      piVar10 = __errno_location();
      strerror(*piVar10);
    }
    (*pIVar2->_vptr_IPalObject[8])(pIVar2,pThread);
  }
  pIVar2 = pobjFileOut;
  if (pobjFileOut != (IPalObject *)0x0) {
    iVar3 = fcntl64(iFdIn,2,1);
    if (iVar3 == -1) {
      if (PAL_InitializeChakraCoreCalled == false) {
LAB_00140fb9:
        abort();
      }
      piVar10 = __errno_location();
      strerror(*piVar10);
    }
    (*pIVar2->_vptr_IPalObject[8])(pIVar2,pThread);
  }
  if (__argv != (char **)0x0) {
    free(*__argv);
    free(__argv);
  }
  StackString<32UL,_char>::~StackString((StackString<32UL,_char> *)local_78);
  if (*(SIZE_T *)(in_FS_OFFSET + 0x28) == lpFileNamePS.m_count) {
    return PVar4;
  }
LAB_001413a0:
  __stack_chk_fail();
}

Assistant:

PAL_ERROR
CorUnix::InternalCreateProcess(
    CPalThread *pThread,
    LPCWSTR lpApplicationName,
    LPWSTR lpCommandLine,
    LPSECURITY_ATTRIBUTES lpProcessAttributes,
    LPSECURITY_ATTRIBUTES lpThreadAttributes,
    BOOL bInheritHandles,
    DWORD dwCreationFlags,
    LPVOID lpEnvironment,
    LPCWSTR lpCurrentDirectory,
    LPSTARTUPINFOW lpStartupInfo,
    LPPROCESS_INFORMATION lpProcessInformation
    )
{
    PAL_ERROR palError = NO_ERROR;
    IPalObject *pobjProcess = NULL;
    IPalObject *pobjProcessRegistered = NULL;
    IDataLock *pLocalDataLock = NULL;
    CProcProcessLocalData *pLocalData;
    IDataLock *pSharedDataLock = NULL;
    CPalThread *pDummyThread = NULL;
    HANDLE hDummyThread = NULL;
    HANDLE hProcess = NULL;
    CObjectAttributes oa(NULL, lpProcessAttributes);

    IPalObject *pobjFileIn = NULL;
    int iFdIn = -1;
    IPalObject *pobjFileOut = NULL;
    int iFdOut = -1;
    IPalObject *pobjFileErr = NULL;
    int iFdErr = -1;

    pid_t processId;
    char * lpFileName;
    PathCharString lpFileNamePS;
    char **lppArgv = NULL;
    UINT nArg;
    int  iRet;
    char **EnvironmentArray=NULL;
    int child_blocking_pipe = -1;
    int parent_blocking_pipe = -1;

    /* Validate parameters */

    /* note : specs indicate lpApplicationName should always
       be NULL; however support for it is already implemented. Leaving the code
       in, specs can change; but rejecting non-NULL for now to conform to the
       spec. */
    if( NULL != lpApplicationName )
    {
        ASSERT("lpApplicationName should be NULL, but is %S instead\n",
               lpApplicationName);
        palError = ERROR_INVALID_PARAMETER;
        goto InternalCreateProcessExit;
    }

    if (0 != (dwCreationFlags & ~(CREATE_SUSPENDED|CREATE_NEW_CONSOLE)))
    {
        ASSERT("Unexpected creation flags (%#x)\n", dwCreationFlags);
        palError = ERROR_INVALID_PARAMETER;
        goto InternalCreateProcessExit;
    }

    /* Security attributes parameters are ignored */
    if (lpProcessAttributes != NULL &&
        (lpProcessAttributes->lpSecurityDescriptor != NULL ||
         lpProcessAttributes->bInheritHandle != TRUE))
    {
        ASSERT("lpProcessAttributes is invalid, parameter ignored (%p)\n",
               lpProcessAttributes);
        palError = ERROR_INVALID_PARAMETER;
        goto InternalCreateProcessExit;
    }

    if (lpThreadAttributes != NULL)
    {
        ASSERT("lpThreadAttributes parameter must be NULL (%p)\n",
               lpThreadAttributes);
        palError = ERROR_INVALID_PARAMETER;
        goto InternalCreateProcessExit;
    }

    /* note : Win32 crashes in this case */
    if(NULL == lpStartupInfo)
    {
        ERROR("lpStartupInfo is NULL\n");
        palError = ERROR_INVALID_PARAMETER;
        goto InternalCreateProcessExit;
    }

    /* Validate lpStartupInfo.cb field */
    if (lpStartupInfo->cb < sizeof(STARTUPINFOW))
    {
        ASSERT("lpStartupInfo parameter structure size is invalid (%u)\n",
              lpStartupInfo->cb);
        palError = ERROR_INVALID_PARAMETER;
        goto InternalCreateProcessExit;
    }

    /* lpStartupInfo should be either zero or STARTF_USESTDHANDLES */
    if (lpStartupInfo->dwFlags & ~STARTF_USESTDHANDLES)
    {
        ASSERT("lpStartupInfo parameter invalid flags (%#x)\n",
              lpStartupInfo->dwFlags);
        palError = ERROR_INVALID_PARAMETER;
        goto InternalCreateProcessExit;
    }

    /* validate given standard handles if we have any */
    if (lpStartupInfo->dwFlags & STARTF_USESTDHANDLES)
    {
        palError = PrepareStandardHandle(
            pThread,
            lpStartupInfo->hStdInput,
            &pobjFileIn,
            &iFdIn
            );

        if (NO_ERROR != palError)
        {
            goto InternalCreateProcessExit;
        }

        palError = PrepareStandardHandle(
            pThread,
            lpStartupInfo->hStdOutput,
            &pobjFileOut,
            &iFdOut
            );

        if (NO_ERROR != palError)
        {
            goto InternalCreateProcessExit;
        }

        palError = PrepareStandardHandle(
            pThread,
            lpStartupInfo->hStdError,
            &pobjFileErr,
            &iFdErr
            );

        if (NO_ERROR != palError)
        {
            goto InternalCreateProcessExit;
        }
    }

    lpFileName = lpFileNamePS.OpenStringBuffer(MAX_LONGPATH-1);
    if (NULL == lpFileName)
    {
        palError = ERROR_NOT_ENOUGH_MEMORY;
        goto InternalCreateProcessExit;
    }
    if (!getFileName(lpApplicationName, lpCommandLine, lpFileName))
    {
        ERROR("Can't find executable!\n");
        palError = ERROR_FILE_NOT_FOUND;
        goto InternalCreateProcessExit;
    }

    lpFileNamePS.CloseBuffer(MAX_LONGPATH-1);
    /* check type of file */
    iRet = checkFileType(lpFileName);

    switch (iRet)
    {
        case FILE_ERROR: /* file not found, or not an executable */
            WARN ("File is not valid (%s)", lpFileName);
            palError = ERROR_FILE_NOT_FOUND;
            goto InternalCreateProcessExit;

        case FILE_UNIX: /* Unix binary file */
            break;  /* nothing to do */

        case FILE_DIR:/*Directory*/
            WARN ("File is a Directory (%s)", lpFileName);
            palError = ERROR_ACCESS_DENIED;
            goto InternalCreateProcessExit;
            break;

        default: /* not supposed to get here */
            ASSERT ("Invalid return type from checkFileType");
            palError = ERROR_FILE_NOT_FOUND;
            goto InternalCreateProcessExit;
    }

    /* build Argument list, lppArgv is allocated in buildArgv function and
       requires to be freed */
    lppArgv = buildArgv(lpCommandLine, lpFileName, &nArg);

    /* set the Environment variable */
    if (lpEnvironment != NULL)
    {
        unsigned i;
        // Since CREATE_UNICODE_ENVIRONMENT isn't supported we know the string is ansi
        unsigned EnvironmentEntries = 0;
        // Convert the environment block to array of strings
        // Count the number of entries
        // Is it a string that contains null terminated string, the end is delimited
        // by two null in a row.
        for (i = 0; ((char *)lpEnvironment)[i]!='\0'; i++)
        {
            EnvironmentEntries ++;
            for (;((char *)lpEnvironment)[i]!='\0'; i++)
            {
            }
        }
        EnvironmentEntries++;
        EnvironmentArray = (char **)InternalMalloc(EnvironmentEntries * sizeof(char *));

        EnvironmentEntries = 0;
        // Convert the environment block to array of strings
        // Count the number of entries
        // Is it a string that contains null terminated string, the end is delimited
        // by two null in a row.
        for (i = 0; ((char *)lpEnvironment)[i]!='\0'; i++)
        {
            EnvironmentArray[EnvironmentEntries] = &((char *)lpEnvironment)[i];
            EnvironmentEntries ++;
            for (;((char *)lpEnvironment)[i]!='\0'; i++)
            {
            }
        }
        EnvironmentArray[EnvironmentEntries] = NULL;
    }

    //
    // Allocate and register the process object for the new process
    //

    palError = g_pObjectManager->AllocateObject(
        pThread,
        &otProcess,
        &oa,
        &pobjProcess
        );

    if (NO_ERROR != palError)
    {
        ERROR("Unable to allocate object for new process\n");
        goto InternalCreateProcessExit;
    }

    palError = g_pObjectManager->RegisterObject(
        pThread,
        pobjProcess,
        &aotProcess,
        PROCESS_ALL_ACCESS,
        &hProcess,
        &pobjProcessRegistered
        );

    //
    // pobjProcess is invalidated by the above call, so
    // NULL it out here
    //

    pobjProcess = NULL;

    if (NO_ERROR != palError)
    {
        ERROR("Unable to register new process object\n");
        goto InternalCreateProcessExit;
    }

    //
    // Create a new "dummy" thread object
    //

    palError = InternalCreateDummyThread(
        pThread,
        lpThreadAttributes,
        &pDummyThread,
        &hDummyThread
        );

    if (dwCreationFlags & CREATE_SUSPENDED)
    {
        int pipe_descs[2];

        if (-1 == pipe(pipe_descs))
        {
            ERROR("pipe() failed! error is %d (%s)\n", errno, strerror(errno));
            palError = ERROR_NOT_ENOUGH_MEMORY;
            goto InternalCreateProcessExit;
        }

        /* [0] is read end, [1] is write end */
        pDummyThread->suspensionInfo.SetBlockingPipe(pipe_descs[1]);
        parent_blocking_pipe = pipe_descs[1];
        child_blocking_pipe = pipe_descs[0];
    }

    palError = pobjProcessRegistered->GetProcessLocalData(
        pThread,
        WriteLock,
        &pLocalDataLock,
        reinterpret_cast<void **>(&pLocalData)
        );

    if (NO_ERROR != palError)
    {
        ASSERT("Unable to obtain local data for new process object\n");
        goto InternalCreateProcessExit;
    }


    /* fork the new process */
    processId = fork();

    if (processId == -1)
    {
        ASSERT("Unable to create a new process with fork()\n");
        if (-1 != child_blocking_pipe)
        {
            close(child_blocking_pipe);
            close(parent_blocking_pipe);
        }

        palError = ERROR_INTERNAL_ERROR;
        goto InternalCreateProcessExit;
    }

    /* From the time the child process begins running, to when it reaches execve,
    the child process is not a real PAL process and does not own any PAL
    resources, although it has access to the PAL resources of its parent process.
    Thus, while the child process is in this window, it is dangerous for it to affect
    its parent's PAL resources. As a consequence, no PAL code should be used
    in this window; all code should make unix calls. Note the use of _exit
    instead of exit to avoid calling PAL_Terminate and the lack of TRACE's and
    ASSERT's. */

    if (processId == 0)  /* child process */
    {
        // At this point, the PAL should be considered uninitialized for this child process.

        // Don't want to enter the init_critsec here since we're trying to avoid
        // calling PAL functions. Furthermore, nothing should be changing
        // the init_count in the child process at this point since this is the only
        // thread executing.
        init_count = 0;

        sigset_t sm;

        //
        // Clear out the signal mask for the new process.
        //

        sigemptyset(&sm);
        iRet = sigprocmask(SIG_SETMASK, &sm, NULL);
        if (iRet != 0)
        {
            _exit(EXIT_FAILURE);
        }

        if (dwCreationFlags & CREATE_SUSPENDED)
        {
            BYTE resume_code = 0;
            ssize_t read_ret;

            /* close the write end of the pipe, the child doesn't need it */
            close(parent_blocking_pipe);

            read_again:
            /* block until ResumeThread writes something to the pipe */
            read_ret = read(child_blocking_pipe, &resume_code, sizeof(resume_code));
            if (sizeof(resume_code) != read_ret)
            {
                if (read_ret == -1 && EINTR == errno)
                {
                    goto read_again;
                }
                else
                {
                    /* note : read might return 0 (and return EAGAIN) if the other
                       end of the pipe gets closed - for example because the parent
                       process dies (very) abruptly */
                    _exit(EXIT_FAILURE);
                }
            }
            if (WAKEUPCODE != resume_code)
            {
                // resume_code should always equal WAKEUPCODE.
                _exit(EXIT_FAILURE);
            }

            close(child_blocking_pipe);
        }

        /* Set the current directory */
        if (lpCurrentDirectory)
        {
            SetCurrentDirectoryW(lpCurrentDirectory);
        }

        /* Set the standard handles to the incoming values */
        if (lpStartupInfo->dwFlags & STARTF_USESTDHANDLES)
        {
            /* For each handle, we need to duplicate the incoming unix
               fd to the corresponding standard one.  The API that I use,
               dup2, will copy the source to the destination, automatically
               closing the existing destination, in an atomic way */
            if (dup2(iFdIn, STDIN_FILENO) == -1)
            {
                // Didn't duplicate standard in.
                _exit(EXIT_FAILURE);
            }

            if (dup2(iFdOut, STDOUT_FILENO) == -1)
            {
                // Didn't duplicate standard out.
                _exit(EXIT_FAILURE);
            }

            if (dup2(iFdErr, STDERR_FILENO) == -1)
            {
                // Didn't duplicate standard error.
                _exit(EXIT_FAILURE);
            }

            /* now close the original FDs, we don't need them anymore */
            close(iFdIn);
            close(iFdOut);
            close(iFdErr);
        }

        /* execute the new process */

        if (EnvironmentArray)
        {
            execve(lpFileName, lppArgv, EnvironmentArray);
        }
        else
        {
            execve(lpFileName, lppArgv, palEnvironment);
        }

        /* if we get here, it means the execve function call failed so just exit */
        _exit(EXIT_FAILURE);
    }

    /* parent process */

    /* close the read end of the pipe, the parent doesn't need it */
    close(child_blocking_pipe);

    /* Set the process ID */
    pLocalData->dwProcessId = processId;
    pLocalDataLock->ReleaseLock(pThread, TRUE);
    pLocalDataLock = NULL;

    //
    // Release file handle info; we don't need them anymore. Note that
    // this must happen after we've released the data locks, as
    // otherwise a deadlock could result.
    //

    if (lpStartupInfo->dwFlags & STARTF_USESTDHANDLES)
    {
        pobjFileIn->ReleaseReference(pThread);
        pobjFileIn = NULL;
        pobjFileOut->ReleaseReference(pThread);
        pobjFileOut = NULL;
        pobjFileErr->ReleaseReference(pThread);
        pobjFileErr = NULL;
    }

    /* fill PROCESS_INFORMATION structure */
    lpProcessInformation->hProcess = hProcess;
    lpProcessInformation->hThread = hDummyThread;
    lpProcessInformation->dwProcessId = processId;
    lpProcessInformation->dwThreadId_PAL_Undefined = 0;


    TRACE("New process created: id=%#x\n", processId);

InternalCreateProcessExit:

    if (NULL != pLocalDataLock)
    {
        pLocalDataLock->ReleaseLock(pThread, FALSE);
    }

    if (NULL != pSharedDataLock)
    {
        pSharedDataLock->ReleaseLock(pThread, FALSE);
    }

    if (NULL != pobjProcess)
    {
        pobjProcess->ReleaseReference(pThread);
    }

    if (NULL != pobjProcessRegistered)
    {
        pobjProcessRegistered->ReleaseReference(pThread);
    }

    if (NO_ERROR != palError)
    {
        if (NULL != hProcess)
        {
            g_pObjectManager->RevokeHandle(pThread, hProcess);
        }

        if (NULL != hDummyThread)
        {
            g_pObjectManager->RevokeHandle(pThread, hDummyThread);
        }
    }

    if (EnvironmentArray)
    {
        free(EnvironmentArray);
    }

    /* if we still have the file structures at this point, it means we
       encountered an error sometime between when we acquired them and when we
       fork()ed. We not only have to release them, we have to give them back
       their close-on-exec flag */
    if (NULL != pobjFileIn)
    {
        if(-1 == fcntl(iFdIn, F_SETFD, 1))
        {
            WARN("couldn't restore close-on-exec flag to stdin descriptor! "
                 "errno is %d (%s)\n", errno, strerror(errno));
        }
        pobjFileIn->ReleaseReference(pThread);
    }

    if (NULL != pobjFileOut)
    {
        if(-1 == fcntl(iFdOut, F_SETFD, 1))
        {
            WARN("couldn't restore close-on-exec flag to stdout descriptor! "
                 "errno is %d (%s)\n", errno, strerror(errno));
        }
        pobjFileOut->ReleaseReference(pThread);
    }

    if (NULL != pobjFileErr)
    {
        if(-1 == fcntl(iFdErr, F_SETFD, 1))
        {
            WARN("couldn't restore close-on-exec flag to stderr descriptor! "
                 "errno is %d (%s)\n", errno, strerror(errno));
        }
        pobjFileErr->ReleaseReference(pThread);
    }

    /* free allocated memory */
    if (lppArgv)
    {
        free(*lppArgv);
        free(lppArgv);
    }

    return palError;
}